

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

ssize_t __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_fmt::v6::internal::error_handler>
::write(arg_formatter_base<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_fmt::v6::internal::error_handler>
        *this,int __fd,void *__buf,size_t __n)

{
  format_specs *specs;
  buffer<char> *pbVar1;
  size_t sVar2;
  ulong uVar3;
  ssize_t extraout_RAX;
  void *pvVar4;
  char *data;
  char *__src;
  ulong __n_00;
  str_writer<char> local_38;
  
  __src = "false";
  if (__fd != 0) {
    __src = "true";
  }
  __n_00 = (ulong)(uint)__fd ^ 5;
  specs = this->specs_;
  if (specs != (format_specs *)0x0) {
    uVar3 = (ulong)specs->precision;
    local_38.size_ = __n_00;
    if (uVar3 < __n_00) {
      local_38.size_ = uVar3;
    }
    if ((long)uVar3 < 0) {
      local_38.size_ = __n_00;
    }
    local_38.s = __src;
    basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
    ::
    write_padded<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::str_writer<char>>
              ((basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                *)this,specs,&local_38);
    return extraout_RAX;
  }
  pbVar1 = (this->writer_).out_.container;
  sVar2 = pbVar1->size_;
  uVar3 = sVar2 + __n_00;
  if (pbVar1->capacity_ < uVar3) {
    (**pbVar1->_vptr_buffer)(pbVar1,uVar3);
  }
  pbVar1->size_ = uVar3;
  pvVar4 = memcpy(pbVar1->ptr_ + sVar2,__src,__n_00);
  return (ssize_t)pvVar4;
}

Assistant:

void write(bool value) {
    string_view sv(value ? "true" : "false");
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }